

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbclipboard.cpp
# Opt level: O0

QVariant * __thiscall
QXcbClipboardMime::retrieveData_sys(QXcbClipboardMime *this,QString *fmt,QMetaType type)

{
  long lVar1;
  bool bVar2;
  xcb_atom_t xVar3;
  ulong uVar4;
  QString *in_RCX;
  QList<unsigned_int> *in_RSI;
  QXcbClipboard *in_RDI;
  long in_FS_OFFSET;
  xcb_atom_t fmtatom;
  int i;
  int size;
  xcb_atom_t *targets;
  bool hasUtf8;
  QList<unsigned_int> atoms;
  QMetaType in_stack_000000a8;
  QMetaType requestedType;
  optional<QByteArray> result;
  QMetaType in_stack_00000198;
  parameter_type in_stack_ffffffffffffff1c;
  QXcbClipboardMime *in_stack_ffffffffffffff20;
  xcb_atom_t in_stack_ffffffffffffff30;
  xcb_atom_t in_stack_ffffffffffffff34;
  QXcbClipboard *this_00;
  int local_a8;
  qsizetype in_stack_ffffffffffffff88;
  undefined8 uVar5;
  undefined1 hasUtf8_00;
  QString *format;
  QByteArray *d;
  undefined1 local_50 [4];
  xcb_atom_t in_stack_ffffffffffffffb4;
  QXcbConnection *in_stack_ffffffffffffffb8;
  bool *in_stack_ffffffffffffffc0;
  QString *format_00;
  QXcbConnection *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  format_00 = in_RCX;
  bVar2 = QString::isEmpty((QString *)0x14daf3);
  if (!bVar2) {
    bVar2 = isEmpty(in_stack_ffffffffffffff20);
    if (!bVar2) {
      (*(code *)(in_RSI->d).d[6].super_QArrayData.alloc)(local_50);
      QList<QString>::~QList((QList<QString> *)0x14db36);
      uVar5 = 0xaaaaaaaaaaaaaaaa;
      format = (QString *)0xaaaaaaaaaaaaaaaa;
      d = (QByteArray *)0xaaaaaaaaaaaaaaaa;
      QList<unsigned_int>::QList((QList<unsigned_int> *)0x14db70);
      QByteArray::data((QByteArray *)in_stack_ffffffffffffff20);
      uVar4 = QByteArray::size((QByteArray *)&in_RSI[2].d.ptr);
      QList<unsigned_int>::reserve(in_RSI,in_stack_ffffffffffffff88);
      for (local_a8 = 0; hasUtf8_00 = (undefined1)((ulong)uVar5 >> 0x38),
          local_a8 < (int)(uVar4 >> 2); local_a8 = local_a8 + 1) {
        QList<unsigned_int>::append((QList<unsigned_int> *)0x14dbd7,in_stack_ffffffffffffff1c);
      }
      QXcbObject::connection((QXcbObject *)&((in_RSI[1].d.d)->super_QArrayData).alloc);
      xVar3 = QXcbMime::mimeAtomForFormat
                        (in_stack_ffffffffffffffd8,format_00,in_stack_000000a8,
                         (QList<unsigned_int> *)in_RCX,in_stack_ffffffffffffffc0);
      if (xVar3 == 0) {
        QVariant::QVariant((QVariant *)0x14dc3c);
      }
      else {
        QXcbClipboard::getDataInFormat(this_00,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
        bVar2 = std::optional<QByteArray>::has_value((optional<QByteArray> *)0x14dcaf);
        if (bVar2) {
          QXcbObject::connection((QXcbObject *)&((in_RSI[1].d.d)->super_QArrayData).alloc);
          std::optional<QByteArray>::value((optional<QByteArray> *)in_stack_ffffffffffffff20);
          QXcbMime::mimeConvertToFormat
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,d,format,in_stack_00000198,
                     (bool)hasUtf8_00);
        }
        else {
          QVariant::QVariant((QVariant *)0x14dcbd);
        }
        std::optional<QByteArray>::~optional((optional<QByteArray> *)0x14dd41);
      }
      QList<unsigned_int>::~QList((QList<unsigned_int> *)0x14dd4e);
      goto LAB_0014dd4e;
    }
  }
  QVariant::QVariant((QVariant *)0x14db11);
LAB_0014dd4e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant retrieveData_sys(const QString &fmt, QMetaType type) const override
    {
        auto requestedType = type;
        if (fmt.isEmpty() || isEmpty())
            return QVariant();

        (void)formats(); // trigger update of format list

        QList<xcb_atom_t> atoms;
        const xcb_atom_t *targets = (const xcb_atom_t *) format_atoms.data();
        int size = format_atoms.size() / sizeof(xcb_atom_t);
        atoms.reserve(size);
        for (int i = 0; i < size; ++i)
            atoms.append(targets[i]);

        bool hasUtf8 = false;
        xcb_atom_t fmtatom = mimeAtomForFormat(m_clipboard->connection(), fmt, requestedType, atoms, &hasUtf8);

        if (fmtatom == 0)
            return QVariant();

        const std::optional<QByteArray> result = m_clipboard->getDataInFormat(modeAtom, fmtatom);
        if (!result.has_value())
            return QVariant();

        return mimeConvertToFormat(m_clipboard->connection(), fmtatom, result.value(), fmt, requestedType, hasUtf8);
    }